

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.cpp
# Opt level: O0

bool __thiscall stream::slice_reader::open_file(slice_reader *this,path_type *file)

{
  char *__file;
  bool bVar1;
  _Ios_Openmode _Var2;
  uint uVar3;
  ulong uVar4;
  type tVar5;
  undefined8 uVar6;
  slice_reader *psVar7;
  slice_reader *psVar8;
  basic_ostream<char,_std::char_traits<char>_> *pbVar9;
  ostream *poVar10;
  slice_error *this_00;
  char *in_RSI;
  undefined **__it;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__it_00;
  long in_RDI;
  ostringstream oss_1;
  ostringstream oss;
  size_t i;
  bool found;
  char magic [8];
  streampos file_size;
  undefined4 in_stack_fffffffffffff8a8;
  log_level in_stack_fffffffffffff8ac;
  logger *in_stack_fffffffffffff8b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8b8;
  logger *in_stack_fffffffffffff8c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8f0;
  ostringstream *this_01;
  char *in_stack_fffffffffffff8f8;
  path *in_stack_fffffffffffff908;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_fffffffffffff910;
  logger *in_stack_fffffffffffff9e0;
  table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,void*>>,unsigned_int,void*,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
  local_608 [16];
  ostringstream local_5f8 [376];
  table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,void*>>,unsigned_int,void*,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
  local_480 [16];
  table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,void*>>,unsigned_int,void*,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
  local_470 [23];
  undefined1 local_459;
  ostringstream local_438 [376];
  table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,void*>>,unsigned_int,void*,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
  local_2c0 [23];
  undefined1 local_2a9;
  undefined1 local_261;
  long local_220;
  byte local_212;
  undefined1 local_211;
  undefined1 local_1d0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_1b8;
  undefined1 local_1a5;
  char *local_18;
  bool local_1;
  
  local_18 = in_RSI;
  bVar1 = boost::filesystem::exists((path *)in_stack_fffffffffffff8b0);
  if (bVar1) {
    if ((logger::quiet & 1U) == 0) {
      logger::logger(in_stack_fffffffffffff8b0,in_stack_fffffffffffff8ac);
      logger::operator<<(in_stack_fffffffffffff8b0,
                         (char (*) [10])
                         CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
      __it = &color::cyan;
      logger::operator<<(in_stack_fffffffffffff8c0,(shell_command *)in_stack_fffffffffffff8b8);
      std::__niter_base<std::pair<bool,std::__cxx11::string>*>
                (local_18,(pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)__it);
      logger::operator<<(in_stack_fffffffffffff8b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
      logger::operator<<(in_stack_fffffffffffff8c0,(shell_command *)in_stack_fffffffffffff8b8);
      local_1a5 = 0x22;
      logger::operator<<(in_stack_fffffffffffff8b0,
                         (char *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
      logger::~logger(in_stack_fffffffffffff9e0);
    }
    std::ifstream::close();
    std::ios::clear((int)in_RDI + 0x80 + (int)*(undefined8 *)(*(long *)(in_RDI + 0x80) + -0x18));
    __file = local_18;
    _Var2 = std::operator|(_S_in,_S_bin);
    _Var2 = std::operator|(_Var2,_S_ate);
    boost::filesystem::basic_ifstream<char,_std::char_traits<char>_>::open
              ((basic_ifstream<char,_std::char_traits<char>_> *)(in_RDI + 0x80),__file,_Var2);
    uVar4 = std::ios::fail();
    if ((uVar4 & 1) == 0) {
      local_1b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
                   )std::istream::tellg();
      std::fpos<__mbstate_t>::fpos
                ((fpos<__mbstate_t> *)in_stack_fffffffffffff8b0,
                 CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
      std::istream::seekg(in_RDI + 0x80,local_1d0._8_8_,local_1d0._16_8_);
      __it_00 = (pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_1d0;
      std::istream::read((char *)(in_RDI + 0x80),(long)__it_00);
      uVar4 = std::ios::fail();
      if ((uVar4 & 1) != 0) {
        std::ifstream::close();
        local_211 = 1;
        uVar6 = __cxa_allocate_exception(0x20);
        std::__niter_base<std::pair<bool,std::__cxx11::string>*>(local_18,__it_00);
        std::operator+(in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
        std::operator+(in_stack_fffffffffffff8b8,(char *)in_stack_fffffffffffff8b0);
        slice_error::slice_error
                  ((slice_error *)in_stack_fffffffffffff8b0,
                   (string *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
        local_211 = 0;
        __cxa_throw(uVar6,&slice_error::typeinfo,slice_error::~slice_error);
      }
      local_212 = 0;
      local_220 = 0;
      while( true ) {
        tVar5 = boost::size<char[2][8]>((char (*) [2] [8])0x1b6a61);
        if (tVar5 == 0) break;
        if (local_1d0._0_8_ == *(long *)((anonymous_namespace)::slice_ids + local_220 * 8)) {
          local_212 = 1;
          break;
        }
        local_220 = local_220 + 1;
      }
      if ((local_212 & 1) == 0) {
        std::ifstream::close();
        local_261 = 1;
        uVar6 = __cxa_allocate_exception(0x20);
        std::__niter_base<std::pair<bool,std::__cxx11::string>*>(local_18,__it_00);
        std::operator+(in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
        std::operator+(in_stack_fffffffffffff8b8,(char *)in_stack_fffffffffffff8b0);
        slice_error::slice_error
                  ((slice_error *)in_stack_fffffffffffff8b0,
                   (string *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
        local_261 = 0;
        __cxa_throw(uVar6,&slice_error::typeinfo,slice_error::~slice_error);
      }
      uVar3 = util::load<unsigned_int>((istream *)0x1b6c12);
      *(uint *)(in_RDI + 0x78) = uVar3;
      uVar4 = std::ios::fail();
      if ((uVar4 & 1) != 0) {
        std::ifstream::close();
        local_2a9 = 1;
        uVar6 = __cxa_allocate_exception(0x20);
        std::__niter_base<std::pair<bool,std::__cxx11::string>*>(local_18,__it_00);
        std::operator+(in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
        std::operator+(in_stack_fffffffffffff8b8,(char *)in_stack_fffffffffffff8b0);
        slice_error::slice_error
                  ((slice_error *)in_stack_fffffffffffff8b0,
                   (string *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
        local_2a9 = 0;
        __cxa_throw(uVar6,&slice_error::typeinfo,slice_error::~slice_error);
      }
      std::fpos<__mbstate_t>::fpos
                ((fpos<__mbstate_t> *)in_stack_fffffffffffff8b0,
                 CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
      psVar7 = boost::unordered::detail::
               table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,void*>>,unsigned_int,void*,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
               ::next_node(local_2c0);
      psVar8 = boost::unordered::detail::
               table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,void*>>,unsigned_int,void*,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
               ::next_node((table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,void*>>,unsigned_int,void*,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                            *)local_1b8._M_local_buf);
      if ((long)psVar8 < (long)psVar7) {
        std::ifstream::close();
        std::__cxx11::ostringstream::ostringstream(local_438);
        std::operator<<((ostream *)local_438,"bad slice size in ");
        pbVar9 = boost::filesystem::operator<<(in_stack_fffffffffffff910,in_stack_fffffffffffff908);
        poVar10 = std::operator<<(pbVar9,": ");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,*(uint *)(in_RDI + 0x78));
        poVar10 = std::operator<<(poVar10," > ");
        psVar7 = boost::unordered::detail::
                 table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,void*>>,unsigned_int,void*,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                 ::next_node((table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,void*>>,unsigned_int,void*,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                              *)local_1b8._M_local_buf);
        std::ostream::operator<<(poVar10,(long)psVar7);
        local_459 = 1;
        uVar6 = __cxa_allocate_exception(0x20);
        std::__cxx11::ostringstream::str();
        slice_error::slice_error
                  ((slice_error *)in_stack_fffffffffffff8b0,
                   (string *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
        local_459 = 0;
        __cxa_throw(uVar6,&slice_error::typeinfo,slice_error::~slice_error);
      }
      std::fpos<__mbstate_t>::fpos
                ((fpos<__mbstate_t> *)in_stack_fffffffffffff8b0,
                 CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
      psVar7 = boost::unordered::detail::
               table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,void*>>,unsigned_int,void*,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
               ::next_node(local_470);
      local_480 = (table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,void*>>,unsigned_int,void*,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                    [16])std::istream::tellg();
      psVar8 = boost::unordered::detail::
               table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,void*>>,unsigned_int,void*,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
               ::next_node(local_480);
      if ((long)psVar7 < (long)psVar8) {
        std::ifstream::close();
        this_01 = local_5f8;
        std::__cxx11::ostringstream::ostringstream(this_01);
        std::operator<<((ostream *)this_01,"bad slice size in ");
        pbVar9 = boost::filesystem::operator<<(in_stack_fffffffffffff910,in_stack_fffffffffffff908);
        poVar10 = std::operator<<(pbVar9,": ");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,*(uint *)(in_RDI + 0x78));
        poVar10 = std::operator<<(poVar10," < ");
        local_608 = (table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,void*>>,unsigned_int,void*,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                      [16])std::istream::tellg();
        psVar7 = boost::unordered::detail::
                 table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,void*>>,unsigned_int,void*,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                 ::next_node(local_608);
        std::ostream::operator<<(poVar10,(long)psVar7);
        this_00 = (slice_error *)__cxa_allocate_exception(0x20);
        std::__cxx11::ostringstream::str();
        slice_error::slice_error
                  (this_00,(string *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
        __cxa_throw(this_00,&slice_error::typeinfo,slice_error::~slice_error);
      }
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool slice_reader::open_file(const path_type & file) {
	
	if(!boost::filesystem::exists(file)) {
		return false;
	}
	
	log_info << "Opening \"" << color::cyan << file.string() << color::reset << '"';
	
	ifs.close();
	ifs.clear();
	
	ifs.open(file, std::ios_base::in | std::ios_base::binary | std::ios_base::ate);
	if(ifs.fail()) {
		return false;
	}
	
	std::streampos file_size = ifs.tellg();
	ifs.seekg(0);
	
	char magic[8];
	if(ifs.read(magic, 8).fail()) {
		ifs.close();
		throw slice_error("could not read slice magic number in \"" + file.string() + "\"");
	}
	bool found = false;
	for(size_t i = 0; boost::size(slice_ids); i++) {
		if(!std::memcmp(magic, slice_ids[i], 8)) {
			found = true;
			break;
		}
	}
	if(!found) {
		ifs.close();
		throw slice_error("bad slice magic number in \"" + file.string() + "\"");
	}
	
	slice_size = util::load<boost::uint32_t>(ifs);
	if(ifs.fail()) {
		ifs.close();
		throw slice_error("could not read slice size in \"" + file.string() + "\"");
	} else if(std::streampos(slice_size) > file_size) {
		ifs.close();
		std::ostringstream oss;
		oss << "bad slice size in " << file << ": " << slice_size << " > " << file_size;
		throw slice_error(oss.str());
	} else if(std::streampos(slice_size) < ifs.tellg()) {
		ifs.close();
		std::ostringstream oss;
		oss << "bad slice size in " << file << ": " << slice_size << " < " << ifs.tellg();
		throw slice_error(oss.str());
	}
	
	return true;
}